

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

int encode_with_recode_loop_and_filter
              (AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size,int64_t *sse,int64_t *rate,
              int *largest_tile_id)

{
  AV1_COMMON *pAVar1;
  YV12_BUFFER_CONFIG *scaled;
  CommonQuantParams *quant_params;
  MACROBLOCKD *xd;
  int32_t *piVar2;
  BLOCK_SIZE BVar3;
  _Bool _Var4;
  AQ_MODE AVar5;
  char cVar6;
  RECODE_LOOP_TYPE RVar7;
  uint8_t uVar8;
  AV1_PRIMARY *pAVar9;
  RefCntBuffer *pRVar10;
  AV1LevelInfo *pAVar11;
  SequenceHeader *pSVar12;
  aom_transfer_characteristics_t aVar13;
  size_t *psVar14;
  int64_t *piVar15;
  DECODER_MODEL_STATUS DVar16;
  uint16_t uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  PixelLevelGradientInfo *pPVar24;
  Block4x4VarInfo *pBVar25;
  VP64x64 *pVVar26;
  YV12_BUFFER_CONFIG *pYVar27;
  ulong uVar28;
  long lVar29;
  RefCntBuffer *pRVar30;
  uint8_t *puVar31;
  int64_t iVar32;
  uint uVar33;
  int16_t (*paiVar34) [8];
  int16_t (*paiVar35) [8];
  uint uVar36;
  int16_t (*paiVar37) [8];
  int *piVar38;
  uint uVar39;
  byte bVar40;
  undefined4 uVar41;
  undefined8 uVar42;
  size_t sVar44;
  long lVar45;
  InterpFilter filter;
  SequenceHeader *pSVar46;
  ulong uVar47;
  segmentation *psVar48;
  RestorationInfo *pRVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  uint local_174;
  ulong local_170;
  undefined8 local_168;
  int local_160;
  int top_index;
  size_t *local_158;
  uint local_150;
  int bottom_index_1;
  ulong local_148;
  int local_13c;
  int local_138;
  int local_134;
  SequenceHeader *local_130;
  EncQuantDequantParams *local_128;
  int16_t (*local_120) [8];
  segmentation *local_118;
  int bottom_index;
  int64_t *local_108;
  long *local_100;
  uint8_t *local_f8;
  size_t local_f0;
  MV_STATS *local_e8;
  YV12_BUFFER_CONFIG *local_e0;
  CommonQuantParams *local_d8;
  int frame_over_shoot_limit;
  undefined4 uStack_cc;
  uint64_t local_b0;
  undefined7 uVar43;
  
  uVar42 = 0;
  local_100 = rate;
  local_f8 = dest;
  local_f0 = dest_size;
  memset(cpi->do_update_frame_probs_txtype,0,0xa0);
  cpi->do_update_vbr_bits_off_target_fast = 0;
  local_158 = size;
  local_108 = sse;
  if ((cpi->sf).hl_sf.recode_loop != '\0') {
    lVar23 = 0x41f08;
    do {
      piVar2 = (int32_t *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[0] + lVar23);
      piVar2[0] = 0;
      piVar2[1] = 0x10000;
      *(undefined8 *)(piVar2 + 2) = 0;
      piVar2 = (int32_t *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar23);
      piVar2[0] = 0;
      piVar2[1] = 0;
      piVar2[2] = 0x10000;
      piVar2[3] = 0;
      *(undefined4 *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[1] + lVar23) = 0;
      lVar23 = lVar23 + 0x24;
    } while (lVar23 != 0x42004);
    (cpi->gm_info).search_done = false;
    av1_set_speed_features_framesize_independent(cpi,cpi->speed);
    av1_set_rd_speed_thresholds(cpi);
    (cpi->common).features.interp_filter = MULTITAP_SHARP2;
    (cpi->common).features.switchable_motion_mode =
         (_Bool)((cpi->oxcf).motion_mode_cfg.enable_obmc |
                (cpi->common).features.allow_warped_motion);
    if ((AOM_RC_FIRST_PASS < (cpi->oxcf).pass) &&
       ((cpi->sf).interp_sf.adaptive_interp_filter_search != 0)) {
      uVar17 = av1_setup_interp_filter_search_mask(cpi);
      (cpi->interp_search_flags).interp_filter_search_mask = uVar17;
    }
    av1_setup_frame_size(cpi);
    iVar18 = av1_superres_in_recode_allowed(cpi);
    if (((iVar18 == 0) || (cpi->superres_mode == AOM_SUPERRES_NONE)) ||
       (uVar39 = 0xffffffff, (cpi->common).superres_scale_denominator != '\b')) {
      top_index = 0;
      bottom_index = 0;
      local_174 = 0;
      av1_set_size_dependent_vars(cpi,(int *)&local_174,&bottom_index,&top_index);
      local_170 = (ulong)(uint)bottom_index;
      uVar28 = (ulong)(uint)top_index;
      av1_set_mv_search_params(cpi);
      if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) &&
          ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) &&
         (((cpi->sf).part_sf.partition_search_type == '\0' &&
          (((cpi->sf).intra_sf.intra_pruning_with_hog != 0 ||
           ((cpi->sf).intra_sf.chroma_intra_pruning_with_hog != 0)))))) {
        pPVar24 = (cpi->td).pixel_gradient_info;
        if (pPVar24 == (PixelLevelGradientInfo *)0x0) {
          pPVar24 = (PixelLevelGradientInfo *)
                    aom_malloc((ulong)(uint)((int)(2L >> (((cpi->common).seq_params)->monochrome &
                                                         0x3f)) << 0x10));
          if (pPVar24 == (PixelLevelGradientInfo *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate pixel_gradient_info");
          }
          (cpi->td).pixel_gradient_info = pPVar24;
        }
        (cpi->td).mb.pixel_gradient_info = pPVar24;
      }
      if (((cpi->oxcf).mode == '\x02') &&
         (((cpi->sf).part_sf.partition_search_type == '\0' ||
          ((0.0 < (double)(cpi->oxcf).speed * -0.25 + 1.0 &&
           (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 ||
            ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0)))))))) {
        pBVar25 = (cpi->td).src_var_info_of_4x4_sub_blocks;
        if (pBVar25 == (Block4x4VarInfo *)0x0) {
          BVar3 = ((cpi->common).seq_params)->sb_size;
          pBVar25 = (Block4x4VarInfo *)
                    aom_malloc((ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                             [BVar3] *
                                       (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                             [BVar3] * 0x10));
          if (pBVar25 == (Block4x4VarInfo *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate source_variance_info");
          }
          (cpi->td).src_var_info_of_4x4_sub_blocks = pBVar25;
        }
        (cpi->td).mb.src_var_info_of_4x4_sub_blocks = pBVar25;
      }
      pAVar1 = &cpi->common;
      local_148 = uVar28;
      if ((cpi->sf).part_sf.partition_search_type == '\x02') {
        BVar3 = ((cpi->common).seq_params)->sb_size;
        iVar18 = (uint)(BVar3 != BLOCK_64X64) * 3 + 1;
        pVVar26 = (cpi->td).vt64x64;
        if ((pVVar26 != (VP64x64 *)0x0) && (iVar18 != (cpi->td).num_64x64_blocks)) {
          aom_free(pVVar26);
          (cpi->td).vt64x64 = (VP64x64 *)0x0;
        }
        if ((cpi->td).vt64x64 == (VP64x64 *)0x0) {
          sVar44 = 0x2aa40;
          if (BVar3 == BLOCK_64X64) {
            sVar44 = 0xaa90;
          }
          pVVar26 = (VP64x64 *)aom_malloc(sVar44);
          (cpi->td).vt64x64 = pVVar26;
          if (pVVar26 == (VP64x64 *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate cpi->td.vt64x64");
          }
          (cpi->td).num_64x64_blocks = iVar18;
        }
      }
      if ((pAVar1->current_frame).frame_type == '\0') {
        pAVar9 = cpi->ppi;
        if ((cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats != 0) {
          memcpy((pAVar9->frame_probs).tx_type_probs,default_tx_type_probs,0x2140);
        }
        if (0x80000001 < (cpi->sf).inter_sf.prune_obmc_prob_thresh + 0x80000001U) {
          memcpy(&pAVar9->frame_probs,default_obmc_probs,0x268);
        }
        if (0 < (cpi->sf).inter_sf.prune_warped_prob_thresh) {
          (pAVar9->frame_probs).warped_probs[3] = 0x40;
          (pAVar9->frame_probs).warped_probs[4] = 0x40;
          (pAVar9->frame_probs).warped_probs[5] = 0x40;
          (pAVar9->frame_probs).warped_probs[6] = 0x40;
          (pAVar9->frame_probs).warped_probs[0] = 0x40;
          (pAVar9->frame_probs).warped_probs[1] = 0x40;
          (pAVar9->frame_probs).warped_probs[2] = 0x40;
          (pAVar9->frame_probs).warped_probs[3] = 0x40;
        }
        if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 2) {
          memcpy((pAVar9->frame_probs).switchable_interp_probs,default_switchable_interp_probs,0x540
                );
        }
      }
      if (((cpi->sf).hl_sf.disable_extra_sc_testing == 0) && (cpi->use_ducky_encode == 0)) {
        av1_determine_sc_tools_with_encoding(cpi,local_174);
      }
      cpi->num_frame_recode = 0;
      local_130 = (SequenceHeader *)&cpi->scaled_source;
      local_e0 = &cpi->scaled_last_source;
      local_128 = &cpi->enc_quant_dequant_params;
      local_d8 = &(cpi->common).quant_params;
      psVar48 = &(cpi->common).seg;
      paiVar34 = (cpi->common).seg.feature_data;
      local_e8 = &cpi->mv_stats;
      local_13c = 0;
      local_138 = 0;
      local_134 = 0;
      local_168 = (AV1_COMMON *)((ulong)local_168._4_4_ << 0x20);
      iVar18 = 0;
      local_120 = paiVar34;
      local_118 = psVar48;
      do {
        if ((((0 < iVar18) && (pYVar27 = cpi->source, pYVar27 != (YV12_BUFFER_CONFIG *)0x0)) &&
            ((cpi->gm_info).search_done == true)) &&
           (((pYVar27->field_2).field_0.y_crop_width != (cpi->common).width ||
            ((pYVar27->field_3).field_0.y_crop_height != (cpi->common).height)))) {
          (cpi->gm_info).search_done = false;
        }
        pYVar27 = av1_realloc_and_scale_if_required
                            (pAVar1,cpi->unscaled_source,(YV12_BUFFER_CONFIG *)local_130,
                             EIGHTTAP_REGULAR,0,false,false,(cpi->oxcf).border_in_pixels,
                             cpi->alloc_pyramid);
        cpi->source = pYVar27;
        if (cpi->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
          pYVar27 = av1_realloc_and_scale_if_required
                              (pAVar1,cpi->unscaled_last_source,local_e0,EIGHTTAP_REGULAR,0,false,
                               false,(cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
          cpi->last_source = pYVar27;
        }
        pAVar9 = cpi->ppi;
        if (((pAVar9->gf_group).frame_parallel_level[cpi->gf_frame_index] == 0) &&
           (((pAVar1->current_frame).frame_type & 0xfd) != 0)) {
          if (0 < iVar18) {
            _Var4 = (cpi->refresh_frame).golden_frame;
            bVar40 = 1;
            lVar23 = 0;
            do {
              pRVar30 = cpi->scaled_ref_buf[lVar23];
              if ((((lVar23 == 3) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
                  (pAVar9->lap_enabled == 0)) &&
                 ((((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)) &&
                  ((pAVar9->use_svc == 0 && (pRVar30 != (RefCntBuffer *)0x0)))))) {
                pRVar10 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                if ((pRVar30->buf).field_2.field_0.y_crop_width ==
                    (pRVar10->buf).field_2.field_0.y_crop_width) {
                  bVar50 = (pRVar30->buf).field_3.field_0.y_crop_height ==
                           (pRVar10->buf).field_3.field_0.y_crop_height;
                }
                else {
                  bVar50 = false;
                }
                bVar40 = bVar50 | _Var4 & 1U;
              }
              if ((pRVar30 != (RefCntBuffer *)0x0) && ((lVar23 != 3 || (bVar40 != 0)))) {
                pRVar30->ref_count = pRVar30->ref_count + -1;
                cpi->scaled_ref_buf[lVar23] = (RefCntBuffer *)0x0;
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 7);
          }
          av1_scale_references(cpi,EIGHTTAP_REGULAR,0,0);
        }
        if ((cpi->use_ducky_encode != 0) && ((cpi->ducky_encode_info).frame_info.qp_mode == '\x01'))
        {
          local_174 = (cpi->ducky_encode_info).frame_info.q_index;
          (cpi->common).delta_q_info.delta_q_present_flag =
               (cpi->ducky_encode_info).frame_info.delta_q_enabled;
        }
        av1_set_quantizer(pAVar1,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,
                          local_174,(uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                          (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                          (cpi->oxcf).tune_cfg.tuning);
        av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
        av1_init_quantizer(local_128,local_d8,((cpi->common).seq_params)->bit_depth,
                           (cpi->oxcf).algo_cfg.sharpness);
        av1_set_variance_partition_thresholds(cpi,local_174,0);
        if (iVar18 == 0) {
          av1_setup_frame(cpi);
        }
        else {
          uVar39 = (cpi->common).features.primary_ref_frame;
          if (uVar39 != 7) {
            iVar19 = -1;
            if ((uVar39 & 0xf8) == 0) {
              iVar19 = (cpi->common).remapped_ref_idx[uVar39 & 7];
            }
            if ((iVar19 != -1) && ((cpi->common).ref_frame_map[iVar19] != (RefCntBuffer *)0x0))
            goto LAB_001bdd3f;
          }
          av1_default_coef_probs(pAVar1);
          av1_setup_frame_contexts(pAVar1);
        }
LAB_001bdd3f:
        AVar5 = (cpi->oxcf).q_cfg.aq_mode;
        if (AVar5 == '\x02') {
          av1_setup_in_frame_q_adj(cpi);
        }
        else if (AVar5 == '\x01') {
          av1_vaq_frame_setup(cpi);
        }
        if (psVar48->enabled == '\0') {
          memset(psVar48,0,0xac);
        }
        else if (((cpi->common).seg.update_data == '\0') &&
                (pRVar30 = (cpi->common).prev_frame, pRVar30 != (RefCntBuffer *)0x0)) {
          paiVar35 = (pRVar30->seg).feature_data;
          lVar23 = 0;
          paiVar37 = paiVar34;
          do {
            (cpi->common).seg.feature_mask[lVar23] = (pRVar30->seg).feature_mask[lVar23];
            lVar45 = 0;
            do {
              (*paiVar37)[lVar45] = (*paiVar35)[lVar45];
              lVar45 = lVar45 + 1;
            } while (lVar45 != 8);
            lVar23 = lVar23 + 1;
            paiVar37 = paiVar37 + 1;
            paiVar35 = paiVar35 + 1;
          } while (lVar23 != 8);
          (cpi->common).seg.segid_preskip = (pRVar30->seg).segid_preskip;
          (cpi->common).seg.last_active_segid = (pRVar30->seg).last_active_segid;
          (cpi->common).seg.enabled = (pRVar30->seg).enabled;
        }
        else {
          av1_calculate_segdata(psVar48);
        }
        pRVar30 = (cpi->common).cur_frame;
        paiVar35 = (pRVar30->seg).feature_data;
        lVar23 = 0;
        paiVar37 = paiVar34;
        do {
          (pRVar30->seg).feature_mask[lVar23] = (cpi->common).seg.feature_mask[lVar23];
          lVar45 = 0;
          do {
            (*paiVar35)[lVar45] = (*paiVar37)[lVar45];
            lVar45 = lVar45 + 1;
          } while (lVar45 != 8);
          lVar23 = lVar23 + 1;
          paiVar35 = paiVar35 + 1;
          paiVar37 = paiVar37 + 1;
        } while (lVar23 != 8);
        (pRVar30->seg).segid_preskip = (cpi->common).seg.segid_preskip;
        (pRVar30->seg).last_active_segid = (cpi->common).seg.last_active_segid;
        (pRVar30->seg).enabled = (cpi->common).seg.enabled;
        if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
          av1_pick_and_set_high_precision_mv(cpi,local_174);
          if ((0 < iVar18) && ((uint)local_168 != (cpi->common).features.allow_high_precision_mv)) {
            (cpi->gm_info).search_done = false;
          }
          local_168 = (AV1_COMMON *)
                      CONCAT44(local_168._4_4_,(uint)(cpi->common).features.allow_high_precision_mv)
          ;
        }
        av1_encode_frame(cpi);
        _Var4 = cpi->do_frame_data_update;
        if ((cpi->mv_stats).valid != 0 && _Var4 == true) {
          local_e8->horz_text = 0;
          local_e8->vert_text = 0;
          local_e8->diag_text = 0;
          local_e8->valid = 0;
          local_e8->total_mv_rate = 0;
          local_e8->hp_total_mv_rate = 0;
          local_e8->lp_total_mv_rate = 0;
          local_e8->horz_text = 0;
          local_e8->mv_joint_count[2] = 0;
          local_e8->mv_joint_count[3] = 0;
          local_e8->last_bit_zero = 0;
          local_e8->last_bit_nonzero = 0;
          local_e8->intra_count = 0;
          local_e8->default_mvs = 0;
          local_e8->mv_joint_count[0] = 0;
          local_e8->mv_joint_count[1] = 0;
          local_e8->high_prec = 0;
          local_e8->q = 0;
          local_e8->order = 0;
          local_e8->inter_count = 0;
        }
        if (((cpi->sf).hl_sf.high_precision_mv_usage == '\0') &&
           ((((cpi->common).current_frame.frame_type & 0xfd) != 0 & _Var4 &
            ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 4) == 1)) {
          av1_collect_mv_stats(cpi,local_174);
        }
        if ((((cpi->sf).hl_sf.recode_loop == '\0') || ((cpi->oxcf).rc_cfg.mode == AOM_Q)) &&
           ((cpi->oxcf).rc_cfg.min_cr == 0)) {
LAB_001bdf8a:
          iVar19 = top_index;
          local_160 = bottom_index;
          pAVar9 = cpi->ppi;
          if (((cpi->rc).is_src_frame_alt_ref == 0) ||
             (bVar52 = false, (cpi->rc).max_frame_bandwidth <= (cpi->rc).projected_frame_size)) {
            uVar39 = (cpi->oxcf).rc_cfg.min_cr;
            if ((int)uVar39 < 1) {
              bVar52 = false;
            }
            else {
              uVar33 = (cpi->rc).projected_frame_size >> 3;
              cVar6 = ((cpi->common).seq_params)->profile;
              lVar23 = 0x24;
              if (cVar6 == '\x01') {
                lVar23 = 0x1e;
              }
              if (cVar6 == '\0') {
                lVar23 = 0xf;
              }
              iVar22 = uVar33 - 0x80;
              if (uVar33 < 0x82) {
                iVar22 = 1;
              }
              auVar53._0_8_ =
                   (double)((long)(cpi->common).height * (long)(cpi->common).superres_upscaled_width
                            * lVar23 >> 3);
              auVar56._8_4_ = iVar22 >> 0x1f;
              auVar56._0_8_ = (long)iVar22;
              auVar56._12_4_ = 0x45300000;
              auVar53._8_8_ = (double)(int)uVar39;
              auVar54._8_4_ = 0;
              auVar54._0_8_ =
                   (auVar56._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,iVar22) - 4503599627370496.0);
              auVar54._12_4_ = 0x40590000;
              auVar54 = divpd(auVar53,auVar54);
              bVar52 = false;
              if (auVar54._0_8_ < auVar54._8_8_) {
                uVar39 = (cpi->rc).worst_quality;
                local_134 = 1;
                if ((int)local_174 < (int)uVar39) {
                  dVar55 = auVar54._8_8_ / auVar54._0_8_;
                  uVar36 = (uint)((double)(int)local_174 * dVar55 * dVar55);
                  uVar33 = local_174 + 1;
                  if ((int)local_174 < (int)uVar36) {
                    uVar33 = uVar36;
                  }
                  uVar36 = local_174 + 0x20;
                  if ((int)uVar33 < (int)(local_174 + 0x20)) {
                    uVar36 = uVar33;
                  }
                  local_174 = uVar36;
                  if ((int)uVar39 <= (int)uVar36) {
                    local_174 = uVar39;
                  }
                  iVar22 = (int)local_170;
                  local_170 = local_170 & 0xffffffff;
                  if (iVar22 < (int)local_174) {
                    local_170 = (ulong)local_174;
                  }
                  uVar28 = (ulong)local_174;
                  if ((int)local_174 <= (int)local_148) {
                    uVar28 = local_148 & 0xffffffff;
                  }
                  bVar52 = true;
                  local_134 = 1;
                  local_148 = uVar28;
                }
              }
              if (local_134 != 0) goto LAB_001be86c;
            }
            if ((((pAVar9->level_params).keep_level_stats != 0) &&
                ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) && (cpi->compressor_stage != '\x01')) {
              if (((pAVar1->current_frame).frame_type == '\0') &&
                 ((pAVar9->gf_group).refbuf_state[cpi->gf_frame_index] == '\0')) {
                av1_init_level_info(cpi);
              }
              uVar28 = (ulong)(cpi->ppi->level_params).target_seq_level_idx[0];
              if ((((uVar28 < 0x1c) &&
                   (pAVar11 = (cpi->ppi->level_params).level_info[0],
                   pAVar11->decoder_models[uVar28].status == '\0')) &&
                  (DVar16 = av1_decoder_model_try_smooth_buf
                                      (cpi,(long)(cpi->rc).projected_frame_size,
                                       pAVar11->decoder_models + uVar28), (byte)(DVar16 - 5) < 2))
                 && (uVar39 = (cpi->rc).worst_quality, (int)local_174 < (int)uVar39)) {
                local_174 = local_174 + 10;
                if ((int)uVar39 <= (int)local_174) {
                  local_174 = uVar39;
                }
                iVar19 = (int)local_170;
                local_170 = local_170 & 0xffffffff;
                if (iVar19 < (int)local_174) {
                  local_170 = (ulong)local_174;
                }
                uVar28 = (ulong)local_174;
                if ((int)local_174 <= (int)local_148) {
                  uVar28 = local_148 & 0xffffffff;
                }
                bVar52 = true;
                local_148 = uVar28;
                goto LAB_001be86c;
              }
            }
            if ((cpi->oxcf).rc_cfg.mode != AOM_Q) {
              local_150 = local_174;
              frame_over_shoot_limit = 0;
              bottom_index_1 = 0;
              av1_rc_compute_frame_size_bounds
                        (cpi,(cpi->rc).this_frame_target,&bottom_index_1,&frame_over_shoot_limit);
              uVar28 = local_148;
              if (frame_over_shoot_limit == 0) {
                frame_over_shoot_limit = 1;
              }
              bVar40 = (pAVar1->current_frame).frame_type;
              uVar39 = (uint)local_148;
              if (((bVar40 == 0) && ((pAVar9->p_rc).this_key_frame_forced != 0)) &&
                 ((cpi->rc).projected_frame_size < (cpi->rc).max_frame_bandwidth)) {
                lVar23 = cpi->ambient_err;
                pYVar27 = &((cpi->common).cur_frame)->buf;
                if (((cpi->common).seq_params)->use_highbitdepth == '\0') {
                  lVar45 = aom_get_y_sse(cpi->source,pYVar27);
                }
                else {
                  lVar45 = aom_highbd_get_y_sse(cpi->source,pYVar27);
                }
                lVar45 = lVar45 + (ulong)(lVar45 == 0);
                if (((lVar23 < lVar45) && ((cpi->rc).projected_frame_size <= frame_over_shoot_limit)
                    ) || ((lVar29 = lVar23 >> 1, lVar29 < lVar45 &&
                          ((cpi->rc).projected_frame_size <= bottom_index_1)))) {
                  uVar28 = (ulong)(local_174 - 1);
                  if ((int)(local_174 - 1) <= (int)local_170) {
                    uVar28 = local_170 & 0xffffffff;
                  }
                  uVar33 = (uint)((lVar23 * (int)local_174) / lVar45);
                  iVar19 = (int)local_170 + (int)uVar28;
LAB_001be8d1:
                  local_174 = iVar19 >> 1;
                  if ((int)uVar33 <= iVar19 >> 1) {
                    local_174 = uVar33;
                  }
                }
                else if ((lVar45 < lVar29) && (bottom_index_1 <= (cpi->rc).projected_frame_size)) {
                  local_170 = (ulong)(local_174 + 1);
                  if ((int)uVar39 <= (int)(local_174 + 1)) {
                    local_170 = uVar28 & 0xffffffff;
                  }
                  uVar33 = (uint)((lVar29 * (int)local_174) / lVar45);
                  iVar19 = (int)local_170 + uVar39 + 1;
                  goto LAB_001be8d1;
                }
                uVar39 = (uint)uVar28;
                if ((int)local_174 < (int)(uint)uVar28) {
                  uVar39 = local_174;
                }
                bVar50 = (int)local_174 < (int)(uint)local_170;
                local_174 = uVar39;
                local_148 = uVar28;
                if (bVar50) {
                  local_174 = (uint)local_170;
                }
              }
              else {
                uVar33 = iVar19;
                if (iVar19 < (int)uVar39) {
                  uVar33 = uVar39;
                }
                iVar22 = (cpi->rc).projected_frame_size;
                iVar21 = (cpi->rc).max_frame_bandwidth;
                if (iVar22 < iVar21) {
                  RVar7 = (cpi->sf).hl_sf.recode_loop;
                  if ((RVar7 == '\x02') ||
                     (RVar7 == '\x01' &&
                      ((bVar40 & 0xfd) == 0 ||
                      ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) == 2)))
                  goto LAB_001be2a1;
                }
                else {
LAB_001be2a1:
                  if (((((int)local_174 < (int)uVar33) && (frame_over_shoot_limit < iVar22)) ||
                      ((local_160 < (int)local_174 && (iVar22 < bottom_index_1)))) ||
                     (((cpi->oxcf).rc_cfg.mode == AOM_CQ &&
                      (((cpi->oxcf).rc_cfg.cq_level < (int)local_174 &&
                       ((long)iVar22 < (long)(cpi->rc).this_frame_target * 7 >> 3)))))) {
                    if ((cpi->rc).this_frame_target < iVar22) {
                      if (local_174 == uVar39 && iVar21 <= iVar22) {
                        dVar55 = av1_convert_qindex_to_q
                                           (uVar39,((cpi->common).seq_params)->bit_depth);
                        uVar39 = av1_find_qindex(dVar55 * ((double)(cpi->rc).projected_frame_size /
                                                          (double)(cpi->rc).max_frame_bandwidth),
                                                 ((cpi->common).seq_params)->bit_depth,
                                                 (cpi->rc).best_quality,(cpi->rc).worst_quality);
                        uVar28 = (ulong)uVar39;
                      }
                      iVar22 = (int)uVar28;
                      uVar47 = (ulong)(local_174 + 1);
                      if (iVar22 <= (int)(local_174 + 1)) {
                        uVar47 = uVar28 & 0xffffffff;
                      }
                      iVar21 = (int)uVar47;
                      if (iVar18 < 3 && local_138 == 0) {
                        if (iVar18 == 2) {
                          local_170 = uVar47;
                          if (((pAVar1->current_frame).frame_type & 0xfd) != 0) goto LAB_001be369;
                          av1_rc_update_rate_correction_factors
                                    (cpi,1,(cpi->common).width,(cpi->common).height);
                          if (iVar19 < iVar22) {
                            iVar19 = iVar22;
                          }
                          iVar20 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,local_160,
                                                     iVar19,(cpi->common).width,(cpi->common).height
                                                    );
                          if (iVar20 < iVar21) {
                            uVar39 = 0;
                            do {
                              av1_rc_update_rate_correction_factors
                                        (cpi,1,(cpi->common).width,(cpi->common).height);
                              iVar20 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,local_160,
                                                         iVar19,(cpi->common).width,
                                                         (cpi->common).height);
                              if ((int)local_170 <= iVar20) break;
                              bVar50 = uVar39 < 9;
                              uVar39 = uVar39 + 1;
                            } while (bVar50);
                          }
                          iVar19 = (((int)local_170 + iVar22) -
                                   ((int)local_170 + iVar22 + 1 >> 0x1f)) + 1 >> 1;
                          local_13c = 1;
                          local_174 = ((iVar19 + iVar20) - (iVar20 + iVar19 + 1 >> 0x1f)) + 1 >> 1;
                        }
                        else {
                          local_170 = uVar47;
                          av1_rc_update_rate_correction_factors
                                    (cpi,1,(cpi->common).width,(cpi->common).height);
                          if (iVar19 < iVar22) {
                            iVar19 = iVar22;
                          }
                          uVar39 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,local_160,
                                                     iVar19,(cpi->common).width,(cpi->common).height
                                                    );
                          if ((int)uVar39 < (int)local_170) {
                            uVar33 = 0;
                            do {
                              av1_rc_update_rate_correction_factors
                                        (cpi,1,(cpi->common).width,(cpi->common).height);
                              uVar39 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,local_160,
                                                         iVar19,(cpi->common).width,
                                                         (cpi->common).height);
                              if ((int)local_170 <= (int)uVar39) break;
                              bVar50 = uVar33 < 9;
                              uVar33 = uVar33 + 1;
                            } while (bVar50);
                          }
                          local_13c = 1;
                          local_174 = uVar39;
                        }
                      }
                      else {
LAB_001be369:
                        local_13c = 1;
                        av1_rc_update_rate_correction_factors
                                  (cpi,1,(cpi->common).width,(cpi->common).height);
                        local_170 = uVar47;
                        local_174 = ((iVar21 + iVar22) - (iVar21 + iVar22 + 1 >> 0x1f)) + 1 >> 1;
                      }
                    }
                    else {
                      uVar28 = (ulong)(local_174 - 1);
                      if ((int)(local_174 - 1) <= (int)local_170) {
                        uVar28 = local_170 & 0xffffffff;
                      }
                      iVar22 = (int)uVar28;
                      if (iVar18 < 3 && local_13c == 0) {
                        if (iVar18 == 2) {
                          if ((bVar40 & 0xfd) != 0) goto LAB_001be431;
                          av1_rc_update_rate_correction_factors
                                    (cpi,1,(cpi->common).width,(cpi->common).height);
                          iVar21 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,local_160,
                                                     iVar19,(cpi->common).width,(cpi->common).height
                                                    );
                          if (iVar22 < iVar21) {
                            uVar39 = 0;
                            do {
                              av1_rc_update_rate_correction_factors
                                        (cpi,1,(cpi->common).width,(cpi->common).height);
                              iVar21 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,local_160,
                                                         iVar19,(cpi->common).width,
                                                         (cpi->common).height);
                              if (iVar21 <= iVar22) break;
                              bVar50 = uVar39 < 9;
                              uVar39 = uVar39 + 1;
                            } while (bVar50);
                          }
                          uVar39 = (uint)local_170;
                          local_174 = ((int)(uVar39 + iVar22) / 2 + iVar21) / 2;
                          uVar33 = local_174;
                          if ((int)uVar39 <= iVar21) {
                            uVar33 = uVar39;
                          }
                          if ((cpi->oxcf).rc_cfg.mode != AOM_CQ) {
                            uVar33 = uVar39;
                          }
                          local_138 = 1;
                          local_170 = (ulong)uVar33;
                        }
                        else {
                          av1_rc_update_rate_correction_factors
                                    (cpi,1,(cpi->common).width,(cpi->common).height);
                          uVar39 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,local_160,
                                                     iVar19,(cpi->common).width,(cpi->common).height
                                                    );
                          if (iVar22 < (int)uVar39) {
                            uVar33 = 0;
                            do {
                              av1_rc_update_rate_correction_factors
                                        (cpi,1,(cpi->common).width,(cpi->common).height);
                              uVar39 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,local_160,
                                                         iVar19,(cpi->common).width,
                                                         (cpi->common).height);
                              if ((int)uVar39 <= iVar22) break;
                              bVar50 = uVar33 < 9;
                              uVar33 = uVar33 + 1;
                            } while (bVar50);
                          }
                          uVar36 = (uint)local_170;
                          uVar33 = uVar39;
                          if ((int)uVar36 <= (int)uVar39) {
                            uVar33 = uVar36;
                          }
                          if ((cpi->oxcf).rc_cfg.mode != AOM_CQ) {
                            uVar33 = uVar36;
                          }
                          local_138 = 1;
                          local_170 = (ulong)uVar33;
                          local_174 = uVar39;
                        }
                      }
                      else {
LAB_001be431:
                        local_138 = 1;
                        av1_rc_update_rate_correction_factors
                                  (cpi,1,(cpi->common).width,(cpi->common).height);
                        local_174 = ((int)local_170 + iVar22) / 2;
                      }
                    }
                    uVar39 = (uint)uVar28;
                    if ((int)local_174 < (int)(uint)uVar28) {
                      uVar39 = local_174;
                    }
                    bVar50 = (int)local_174 < (int)(uint)local_170;
                    local_174 = uVar39;
                    local_148 = uVar28;
                    if (bVar50) {
                      local_174 = (uint)local_170;
                    }
                  }
                }
              }
              bVar52 = local_174 != local_150;
            }
          }
LAB_001be86c:
          bVar50 = true;
          if ((cpi->use_ducky_encode == 0) && (bVar52)) {
            iVar18 = iVar18 + 1;
            iVar19 = cpi->num_frame_recode + 1;
            if (8 < cpi->num_frame_recode) {
              iVar19 = 9;
            }
            cpi->num_frame_recode = iVar19;
            bVar50 = false;
          }
          bVar40 = 0;
          paiVar34 = local_120;
          size = local_158;
          psVar48 = local_118;
        }
        else {
          av1_finalize_encoded_frame(cpi);
          frame_over_shoot_limit = 0;
          (cpi->rc).coefficient_size = 0;
          iVar19 = av1_pack_bitstream(cpi,local_f8,local_f0,size,&frame_over_shoot_limit);
          if (iVar19 == 0) {
            (cpi->rc).projected_frame_size = (int)*size << 3;
            goto LAB_001bdf8a;
          }
          bVar50 = true;
          bVar40 = 1;
        }
      } while ((!bVar50) && (bVar40 == 0));
      uVar39 = (uint)bVar40;
    }
    goto LAB_001bf4ca;
  }
  iVar18 = (cpi->resize_pending_params).width;
  if ((iVar18 == 0) || (iVar19 = (cpi->resize_pending_params).height, iVar19 == 0)) {
    uVar41 = 0;
  }
  else {
    uVar43 = (undefined7)((ulong)uVar42 >> 8);
    uVar41 = (undefined4)CONCAT71(uVar43,1);
    if ((cpi->common).width == iVar18) {
      uVar41 = (undefined4)CONCAT71(uVar43,(cpi->common).height != iVar19);
    }
  }
  frame_over_shoot_limit = 0;
  bottom_index_1 = 0;
  top_index = 0;
  iVar18 = cpi->ppi->use_svc;
  if (iVar18 == 0) {
    filter = EIGHTTAP_SMOOTH;
  }
  else {
    filter = (cpi->svc).downsample_filter_type[(cpi->svc).spatial_layer_id];
  }
  local_130 = (SequenceHeader *)CONCAT44(local_130._4_4_,uVar41);
  if (iVar18 == 0) {
    local_168 = (AV1_COMMON *)((ulong)local_168._4_4_ << 0x20);
  }
  else {
    local_168 = (AV1_COMMON *)
                CONCAT44(local_168._4_4_,
                         (cpi->svc).downsample_filter_phase[(cpi->svc).spatial_layer_id]);
  }
  pAVar1 = &cpi->common;
  pYVar27 = cpi->unscaled_source;
  if ((((((((cpi->rc).postencode_drop != 0) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
         (cpi->ppi->lap_enabled == 0)) &&
        (((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)))) &&
       (((cpi->oxcf).rc_cfg.mode == AOM_CBR &&
        ((0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark && ((cpi->rc).rtc_external_ratectrl == 0))))
       )) && (((pAVar1->current_frame).frame_type & 0xfd) != 0)) &&
     ((cpi->svc).spatial_layer_id == 0)) {
    av1_save_all_coding_context(cpi);
  }
  lVar23 = 0x41f08;
  do {
    piVar2 = (int32_t *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[0] + lVar23);
    piVar2[0] = 0;
    piVar2[1] = 0x10000;
    *(undefined8 *)(piVar2 + 2) = 0;
    piVar2 = (int32_t *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar23);
    piVar2[0] = 0;
    piVar2[1] = 0;
    piVar2[2] = 0x10000;
    piVar2[3] = 0;
    *(undefined4 *)((long)(cpi->enc_quant_dequant_params).quants.y_quant[1] + lVar23) = 0;
    lVar23 = lVar23 + 0x24;
  } while (lVar23 != 0x42004);
  (cpi->gm_info).search_done = false;
  av1_set_speed_features_framesize_independent(cpi,cpi->speed);
  av1_set_rd_speed_thresholds(cpi);
  (cpi->common).features.interp_filter = MULTITAP_SHARP2;
  (cpi->common).features.switchable_motion_mode =
       (_Bool)((cpi->oxcf).motion_mode_cfg.enable_obmc | (cpi->common).features.allow_warped_motion)
  ;
  av1_setup_frame_size(cpi);
  uVar39 = (cpi->common).features.primary_ref_frame;
  if (uVar39 == 7) {
LAB_001bea8b:
    pRVar30 = (RefCntBuffer *)0x0;
  }
  else {
    iVar18 = -1;
    if ((uVar39 & 0xf8) == 0) {
      iVar18 = (cpi->common).remapped_ref_idx[uVar39 & 7];
    }
    if (iVar18 == -1) goto LAB_001bea8b;
    pRVar30 = (cpi->common).ref_frame_map[iVar18];
  }
  (cpi->common).prev_frame = pRVar30;
  av1_set_size_dependent_vars(cpi,&top_index,&bottom_index_1,&frame_over_shoot_limit);
  av1_set_mv_search_params(cpi);
  if (((cpi->common).current_frame.frame_number == 0) &&
     (((cpi->ppi->use_svc != 0 || (0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark)) &&
      ((cpi->svc).temporal_layer_id == 0)))) {
    pSVar46 = (cpi->common).seq_params;
    iVar18 = aom_alloc_frame_buffer
                       (&(cpi->svc).source_last_TL0,(cpi->oxcf).frm_dim_cfg.width,
                        (cpi->oxcf).frm_dim_cfg.height,pSVar46->subsampling_x,pSVar46->subsampling_y
                        ,(uint)pSVar46->use_highbitdepth,(cpi->oxcf).border_in_pixels,
                        (cpi->common).features.byte_alignment,false,0);
    if (iVar18 != 0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate buffer for source_last_TL0");
    }
  }
  if (cpi->ppi->use_svc == 0) {
    iVar18 = (cpi->common).width;
    iVar19 = (pYVar27->field_2).field_0.y_crop_width;
    if ((iVar18 * 2 == iVar19) &&
       (iVar22 = (cpi->common).height, iVar22 * 2 == (pYVar27->field_3).field_0.y_crop_height)) {
      filter = (0xe100 < iVar22 * iVar18) * '\x02' + EIGHTTAP_SMOOTH;
    }
    else {
      if ((iVar18 << 2 != iVar19) ||
         ((cpi->common).height << 2 != (pYVar27->field_3).field_0.y_crop_height)) {
        local_168 = (AV1_COMMON *)CONCAT44(local_168._4_4_,8);
        if ((iVar18 << 2 == iVar19 * 3) &&
           ((cpi->common).height << 2 == (pYVar27->field_3).field_0.y_crop_height * 3)) {
          filter = EIGHTTAP_REGULAR;
        }
        goto LAB_001bebdc;
      }
      filter = EIGHTTAP_SMOOTH;
    }
    local_168 = (AV1_COMMON *)CONCAT44(local_168._4_4_,8);
  }
LAB_001bebdc:
  if ((((((pAVar1->current_frame).frame_type & 0xfd) == 0) &&
       ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) &&
      ((cpi->sf).part_sf.partition_search_type == '\0')) &&
     (((cpi->sf).intra_sf.intra_pruning_with_hog != 0 ||
      ((cpi->sf).intra_sf.chroma_intra_pruning_with_hog != 0)))) {
    pPVar24 = (cpi->td).pixel_gradient_info;
    if (pPVar24 == (PixelLevelGradientInfo *)0x0) {
      pPVar24 = (PixelLevelGradientInfo *)
                aom_malloc((ulong)(uint)((int)(2L >> (((cpi->common).seq_params)->monochrome & 0x3f)
                                              ) << 0x10));
      if (pPVar24 == (PixelLevelGradientInfo *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pixel_gradient_info");
      }
      (cpi->td).pixel_gradient_info = pPVar24;
    }
    (cpi->td).mb.pixel_gradient_info = pPVar24;
  }
  if (((cpi->oxcf).mode == '\x02') &&
     (((cpi->sf).part_sf.partition_search_type == '\0' ||
      ((0.0 < (double)(cpi->oxcf).speed * -0.25 + 1.0 &&
       (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 || ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0))))
      )))) {
    pBVar25 = (cpi->td).src_var_info_of_4x4_sub_blocks;
    if (pBVar25 == (Block4x4VarInfo *)0x0) {
      BVar3 = ((cpi->common).seq_params)->sb_size;
      pBVar25 = (Block4x4VarInfo *)
                aom_malloc((ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                         [BVar3] *
                                   (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                         [BVar3] * 0x10));
      if (pBVar25 == (Block4x4VarInfo *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate source_variance_info");
      }
      (cpi->td).src_var_info_of_4x4_sub_blocks = pBVar25;
    }
    (cpi->td).mb.src_var_info_of_4x4_sub_blocks = pBVar25;
  }
  if ((cpi->sf).part_sf.partition_search_type == '\x02') {
    BVar3 = ((cpi->common).seq_params)->sb_size;
    iVar18 = (uint)(BVar3 != BLOCK_64X64) * 3 + 1;
    pVVar26 = (cpi->td).vt64x64;
    if ((pVVar26 != (VP64x64 *)0x0) && (iVar18 != (cpi->td).num_64x64_blocks)) {
      aom_free(pVVar26);
      (cpi->td).vt64x64 = (VP64x64 *)0x0;
    }
    if ((cpi->td).vt64x64 == (VP64x64 *)0x0) {
      sVar44 = 0x2aa40;
      if (BVar3 == BLOCK_64X64) {
        sVar44 = 0xaa90;
      }
      pVVar26 = (VP64x64 *)aom_malloc(sVar44);
      (cpi->td).vt64x64 = pVVar26;
      if (pVVar26 == (VP64x64 *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->td.vt64x64");
      }
      (cpi->td).num_64x64_blocks = iVar18;
    }
  }
  if (((pAVar1->current_frame).frame_type == '\0') ||
     (((cpi->sf).inter_sf.extra_prune_warped != 0 && ((cpi->refresh_frame).golden_frame == true))))
  {
    pAVar9 = cpi->ppi;
    if ((cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats != 0) {
      memcpy((pAVar9->frame_probs).tx_type_probs,default_tx_type_probs,0x2140);
    }
    if (0x80000001 < (cpi->sf).inter_sf.prune_obmc_prob_thresh + 0x80000001U) {
      memcpy(&pAVar9->frame_probs,default_obmc_probs,0x268);
    }
    if (0 < (cpi->sf).inter_sf.prune_warped_prob_thresh) {
      (pAVar9->frame_probs).warped_probs[3] = 0x40;
      (pAVar9->frame_probs).warped_probs[4] = 0x40;
      (pAVar9->frame_probs).warped_probs[5] = 0x40;
      (pAVar9->frame_probs).warped_probs[6] = 0x40;
      (pAVar9->frame_probs).warped_probs[0] = 0x40;
      (pAVar9->frame_probs).warped_probs[1] = 0x40;
      (pAVar9->frame_probs).warped_probs[2] = 0x40;
      (pAVar9->frame_probs).warped_probs[3] = 0x40;
    }
    if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 2) {
      memcpy((pAVar9->frame_probs).switchable_interp_probs,default_switchable_interp_probs,0x540);
    }
  }
  scaled = &cpi->scaled_source;
  pYVar27 = av1_realloc_and_scale_if_required
                      (pAVar1,pYVar27,scaled,filter,(uint)local_168,true,false,
                       (cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
  cpi->source = pYVar27;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0 || ((ulong)local_130 & 1) != 0) {
    iVar18 = (cpi->common).mi_params.mi_cols * (cpi->common).mi_params.mi_rows >> 2;
    if ((cpi->consec_zero_mv != (uint8_t *)0x0) && (cpi->consec_zero_mv_alloc_size < iVar18)) {
      aom_free(cpi->consec_zero_mv);
      cpi->consec_zero_mv_alloc_size = 0;
      puVar31 = (uint8_t *)aom_malloc((long)iVar18);
      cpi->consec_zero_mv = puVar31;
      if (puVar31 == (uint8_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->consec_zero_mv");
      }
      cpi->consec_zero_mv_alloc_size = iVar18;
    }
    memset(cpi->consec_zero_mv,0,(long)iVar18);
  }
  if (cpi->scaled_last_source_available == 0) {
    if (cpi->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
      pYVar27 = av1_realloc_and_scale_if_required
                          (pAVar1,cpi->unscaled_last_source,&cpi->scaled_last_source,filter,
                           (uint)local_168,true,false,(cpi->oxcf).border_in_pixels,
                           cpi->alloc_pyramid);
      cpi->last_source = pYVar27;
    }
  }
  else {
    cpi->last_source = &cpi->scaled_last_source;
    cpi->scaled_last_source_available = 0;
  }
  if ((cpi->sf).rt_sf.use_temporal_noise_estimate != 0) {
    av1_update_noise_estimate(cpi);
  }
  if ((cpi->svc).number_spatial_layers == 1) {
    if (((cpi->oxcf).superres_cfg.enable_superres == false) && ((cpi->ref_frame_flags & 8U) != 0)) {
      lVar23 = (long)(cpi->common).remapped_ref_idx[3];
      if (lVar23 == -1) {
        pRVar30 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar30 = (cpi->common).ref_frame_map[lVar23];
      }
      if (((pRVar30 == (RefCntBuffer *)0x0) ||
          ((pRVar30->buf).field_2.field_0.y_crop_width != (cpi->common).width)) ||
         ((pRVar30->buf).field_3.field_0.y_crop_height != (cpi->common).height)) {
        cpi->ref_frame_flags = cpi->ref_frame_flags & 0xfffffff7;
      }
    }
    if ((cpi->ref_frame_flags & 0x40U) != 0) {
      lVar23 = (long)(cpi->common).remapped_ref_idx[6];
      if (lVar23 == -1) {
        pRVar30 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar30 = (cpi->common).ref_frame_map[lVar23];
      }
      if (((pRVar30 == (RefCntBuffer *)0x0) ||
          ((pRVar30->buf).field_2.field_0.y_crop_width != (cpi->common).width)) ||
         ((pRVar30->buf).field_3.field_0.y_crop_height != (cpi->common).height)) {
        cpi->ref_frame_flags = cpi->ref_frame_flags & 0xffffffbf;
      }
    }
  }
  if (((cpi->ppi->gf_group).frame_parallel_level[cpi->gf_frame_index] == 0) &&
     (((pAVar1->current_frame).frame_type & 0xfd) != 0)) {
    av1_scale_references(cpi,filter,(uint)local_168,1);
  }
  av1_set_quantizer(pAVar1,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,top_index,
                    (uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                    (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                    (cpi->oxcf).tune_cfg.tuning);
  av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
  quant_params = &(cpi->common).quant_params;
  av1_init_quantizer(&cpi->enc_quant_dequant_params,quant_params,
                     ((cpi->common).seq_params)->bit_depth,(cpi->oxcf).algo_cfg.sharpness);
  av1_set_variance_partition_thresholds(cpi,top_index,0);
  av1_setup_frame(cpi);
  if ((((cpi->sf).rt_sf.overshoot_detection_cbr == '\x01') && ((cpi->rc).high_source_sad != 0)) &&
     (iVar18 = av1_encodedframe_overshoot_cbr(cpi,&top_index), iVar18 != 0)) {
    av1_set_quantizer(pAVar1,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,top_index,
                      (uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                      (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                      (cpi->oxcf).tune_cfg.tuning);
    av1_set_speed_features_qindex_dependent(cpi,(cpi->oxcf).speed);
    av1_init_quantizer(&cpi->enc_quant_dequant_params,quant_params,
                       ((cpi->common).seq_params)->bit_depth,(cpi->oxcf).algo_cfg.sharpness);
    av1_set_variance_partition_thresholds(cpi,top_index,0);
    if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
        ((cpi->common).features.error_resilient_mode != false)) ||
       ((cpi->common).features.primary_ref_frame == 7)) {
      av1_setup_frame(cpi);
    }
  }
  av1_apply_active_map(cpi);
  if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
    av1_cyclic_refresh_setup(cpi);
  }
  psVar48 = &(cpi->common).seg;
  if ((cpi->common).seg.enabled == '\0') {
    memset(psVar48,0,0xac);
  }
  else if (((cpi->common).seg.update_data == '\0') &&
          (pRVar30 = (cpi->common).prev_frame, pRVar30 != (RefCntBuffer *)0x0)) {
    paiVar34 = (pRVar30->seg).feature_data;
    paiVar35 = (cpi->common).seg.feature_data;
    lVar23 = 0;
    do {
      (cpi->common).seg.feature_mask[lVar23] = (pRVar30->seg).feature_mask[lVar23];
      lVar45 = 0;
      do {
        (*paiVar35)[lVar45] = (*paiVar34)[lVar45];
        lVar45 = lVar45 + 1;
      } while (lVar45 != 8);
      lVar23 = lVar23 + 1;
      paiVar35 = paiVar35 + 1;
      paiVar34 = paiVar34 + 1;
    } while (lVar23 != 8);
    (cpi->common).seg.segid_preskip = (pRVar30->seg).segid_preskip;
    (cpi->common).seg.last_active_segid = (pRVar30->seg).last_active_segid;
    (cpi->common).seg.enabled = (pRVar30->seg).enabled;
  }
  else {
    av1_calculate_segdata(psVar48);
  }
  pRVar30 = (cpi->common).cur_frame;
  paiVar35 = (cpi->common).seg.feature_data;
  paiVar34 = (pRVar30->seg).feature_data;
  lVar23 = 0;
  do {
    (pRVar30->seg).feature_mask[lVar23] = (cpi->common).seg.feature_mask[lVar23];
    lVar45 = 0;
    do {
      (*paiVar34)[lVar45] = (*paiVar35)[lVar45];
      lVar45 = lVar45 + 1;
    } while (lVar45 != 8);
    lVar23 = lVar23 + 1;
    paiVar34 = paiVar34 + 1;
    paiVar35 = paiVar35 + 1;
  } while (lVar23 != 8);
  (pRVar30->seg).segid_preskip = (cpi->common).seg.segid_preskip;
  (pRVar30->seg).last_active_segid = (cpi->common).seg.last_active_segid;
  (pRVar30->seg).enabled = (cpi->common).seg.enabled;
  if (((((cpi->ppi->b_calculate_psnr != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
       (cpi->compressor_stage != '\x01')) &&
      (((cpi->common).show_frame != 0 && (cpi->is_dropped_frame == false)))) &&
     ((cpi->sf).rt_sf.use_rtc_tf != 0)) {
    pSVar46 = (cpi->common).seq_params;
    pYVar27 = &cpi->orig_source;
    if (((((cpi->orig_source).buffer_alloc_sz == 0) ||
         ((cpi->rc).prev_coded_width != (cpi->oxcf).frm_dim_cfg.width)) ||
        ((cpi->rc).prev_coded_height != (cpi->oxcf).frm_dim_cfg.height)) &&
       (iVar18 = aom_alloc_frame_buffer
                           (pYVar27,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,
                            pSVar46->subsampling_x,pSVar46->subsampling_y,
                            (uint)pSVar46->use_highbitdepth,(cpi->oxcf).border_in_pixels,
                            (cpi->common).features.byte_alignment,false,0), iVar18 != 0)) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate scaled buffer")
      ;
    }
    aom_yv12_copy_y_c(cpi->source,pYVar27,1);
    aom_yv12_copy_u_c(cpi->source,pYVar27,1);
    aom_yv12_copy_v_c(cpi->source,pYVar27,1);
  }
  if (((pAVar1->current_frame).frame_type & 0xfd) != 0) {
    av1_pick_and_set_high_precision_mv(cpi,top_index);
  }
  av1_encode_frame(cpi);
  iVar18 = (cpi->rc).rtc_external_ratectrl;
  if ((iVar18 == 0) && (((pAVar1->current_frame).frame_type & 0xfd) != 0)) {
    iVar22 = ((cpi->rc).cnt_zeromv * 100) /
             ((cpi->common).mi_params.mi_cols * (cpi->common).mi_params.mi_rows);
    iVar19 = cpi->ppi->use_svc;
    if ((iVar19 == 0) ||
       (((cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame == 0 &&
        ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))) {
      iVar21 = (cpi->rc).avg_frame_low_motion;
      if (iVar21 != 0) {
        iVar21 = iVar21 * 3;
        iVar20 = iVar21 + iVar22;
        iVar22 = iVar22 + 3 + iVar21;
        if (-1 < iVar20) {
          iVar22 = iVar20;
        }
        iVar22 = iVar22 >> 2;
      }
      (cpi->rc).avg_frame_low_motion = iVar22;
      if (((iVar19 != 0) && (iVar19 = (cpi->svc).number_spatial_layers, 1 < iVar19)) &&
         (uVar39 = iVar19 - 1, (cpi->svc).spatial_layer_id == uVar39)) {
        iVar19 = (cpi->svc).number_temporal_layers;
        uVar28 = (ulong)uVar39;
        piVar38 = &(cpi->svc).layer_context[(cpi->svc).temporal_layer_id].rc.avg_frame_low_motion;
        do {
          *piVar38 = (cpi->rc).avg_frame_low_motion;
          piVar38 = piVar38 + (long)iVar19 * 0xce0;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
    }
  }
  if ((((((pAVar1->current_frame).frame_type & 0xfd) != 0) && ((cpi->oxcf).rc_cfg.mode == AOM_CBR))
      && ((((cpi->oxcf).mode == '\x01' && (((cpi->svc).number_spatial_layers == 1 && (iVar18 == 0)))
           ) && ((cpi->svc).number_temporal_layers == 1)))) &&
     (((cpi->ppi->rtc_ref).set_ref_frame_config == 0 &&
      ((cpi->sf).rt_sf.gf_refresh_based_on_qp != 0)))) {
    av1_adjust_gf_refresh_qp_one_pass_rt(cpi);
  }
  if ((((1 < (cpi->common).current_frame.frame_number) && (cpi->ppi->use_svc == 0)) &&
      ((cpi->scaled_source).field_5.field_0.y_buffer != (uint8_t *)0x0)) &&
     ((((cpi->scaled_last_source).field_5.field_0.y_buffer != (uint8_t *)0x0 &&
       ((cpi->scaled_source).field_2.field_0.y_crop_width ==
        (cpi->scaled_last_source).field_2.field_0.y_crop_width)) &&
      (((cpi->scaled_source).field_3.field_0.y_crop_height ==
        (cpi->scaled_last_source).field_3.field_0.y_crop_height &&
       (((cpi->common).width != (cpi->unscaled_source->field_2).field_0.y_crop_width ||
        ((cpi->common).height != (cpi->unscaled_source->field_3).field_0.y_crop_height)))))))) {
    pYVar27 = &cpi->scaled_last_source;
    cpi->scaled_last_source_available = 1;
    aom_yv12_copy_y_c(scaled,pYVar27,1);
    aom_yv12_copy_u_c(scaled,pYVar27,1);
    aom_yv12_copy_v_c(scaled,pYVar27,1);
  }
  uVar39 = 0;
LAB_001bf4ca:
  if (uVar39 == 0) {
    pSVar46 = (cpi->common).seq_params;
    if (((cpi->ppi->p_rc).next_key_frame_forced != 0) && ((cpi->rc).frames_to_key == 1)) {
      pYVar27 = &((cpi->common).cur_frame)->buf;
      if (pSVar46->use_highbitdepth == '\0') {
        iVar32 = aom_get_y_sse(cpi->source,pYVar27);
      }
      else {
        iVar32 = aom_highbd_get_y_sse(cpi->source,pYVar27);
      }
      cpi->ambient_err = iVar32;
    }
    pRVar30 = (cpi->common).cur_frame;
    aVar13 = pSVar46->transfer_characteristics;
    (pRVar30->buf).color_primaries = pSVar46->color_primaries;
    (pRVar30->buf).transfer_characteristics = aVar13;
    (pRVar30->buf).matrix_coefficients = pSVar46->matrix_coefficients;
    (pRVar30->buf).monochrome = pSVar46->monochrome;
    (pRVar30->buf).chroma_sample_position = pSVar46->chroma_sample_position;
    (pRVar30->buf).color_range = pSVar46->color_range;
    iVar18 = (cpi->common).render_height;
    (pRVar30->buf).render_width = (cpi->common).render_width;
    (pRVar30->buf).render_height = iVar18;
    iVar18 = (cpi->mt_info).pipeline_lpf_mt_with_enc;
    if (iVar18 == 0) {
      (cpi->common).lf.filter_level[0] = 0;
      (cpi->common).lf.filter_level[1] = 0;
      (cpi->common).lf.backup_filter_level[0] = 0;
      (cpi->common).lf.backup_filter_level[1] = 0;
      (cpi->common).cdef_info.cdef_bits = 0;
      (cpi->common).cdef_info.nb_cdef_strengths = 1;
      (cpi->common).cdef_info.cdef_strengths[0] = 0;
      (cpi->common).cdef_info.cdef_uv_strengths[0] = 0;
      (cpi->common).rst_info[0].frame_restoration_type = RESTORE_NONE;
      (cpi->common).rst_info[1].frame_restoration_type = RESTORE_NONE;
      (cpi->common).rst_info[2].frame_restoration_type = RESTORE_NONE;
    }
    local_168 = &cpi->common;
    if ((cpi->common).features.allow_intrabc == false) {
      iVar19 = (cpi->mt_info).num_mod_workers[5];
      pSVar12 = (cpi->common).seq_params;
      uVar8 = pSVar12->monochrome;
      (cpi->td).mb.rdmult = (cpi->rd).RDMULT;
      _Var4 = (cpi->common).features.coded_lossless;
      if (_Var4 == false) {
        bVar50 = iVar18 == 0 && (cpi->common).tiles.large_scale == 0;
      }
      else {
        bVar50 = false;
      }
      bVar52 = true;
      bVar51 = true;
      if (pSVar12->enable_cdef != '\0' && _Var4 == false) {
        bVar51 = (cpi->common).tiles.large_scale != 0;
      }
      if ((pSVar12->enable_restoration != '\0') && ((cpi->common).features.all_lossless == false)) {
        bVar52 = (cpi->common).tiles.large_scale != 0;
      }
      bVar40 = 0xc;
      if (((cpi->ppi->rtc_ref).non_reference_frame == 0) &&
         (bVar40 = 0, (cpi->oxcf).algo_cfg.skip_postproc_filtering == true)) {
        bVar40 = cpi->ppi->b_calculate_psnr == 0;
        if ((!(bool)(~bVar52 & 1U | !(bool)bVar40)) &&
           (bVar40 = 2, (cpi->common).width == (cpi->common).superres_upscaled_width)) {
          if (bVar51) {
            bVar40 = bVar50 << 3;
          }
          else {
            bVar40 = 4;
            if (bVar50 != false) {
              bVar40 = ((cpi->sf).lpf_sf.cdef_pick_method == CDEF_PICK_FROM_Q) * '\b' + 4;
            }
          }
        }
      }
      xd = &(cpi->td).mb.e_mbd;
      if (bVar50 != false) {
        local_128 = (EncQuantDequantParams *)CONCAT71(local_128._1_7_,uVar8 == '\0');
        local_130 = pSVar46;
        av1_pick_filter_level(cpi->source,cpi,(cpi->sf).lpf_sf.lpf_pick);
        pSVar46 = local_130;
        if ((((cpi->common).lf.filter_level[0] != 0) || ((cpi->common).lf.filter_level[1] != 0)) &&
           (bVar40 < 8)) {
          iVar18 = 0;
          if ((0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect) &&
             (0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr)) {
            iVar18 = ((cpi->sf).lpf_sf.lpf_pick == '\x03') + 1;
          }
          av1_loop_filter_frame_mt
                    (&((cpi->common).cur_frame)->buf,local_168,xd,0,((uint)local_128 & 0xff) * 2 + 1
                     ,0,(cpi->mt_info).workers,iVar19,&(cpi->mt_info).lf_row_sync,iVar18);
        }
      }
      if (!bVar52) {
        av1_loop_restoration_save_boundary_lines(&((cpi->common).cur_frame)->buf,local_168,0);
      }
      if (!bVar51) {
        iVar18 = (cpi->mt_info).num_mod_workers[7];
        av1_cdef_search(cpi);
        if ((bVar40 & 4) == 0) {
          if (iVar18 < 2) {
            av1_cdef_frame(&((cpi->common).cur_frame)->buf,local_168,xd,av1_cdef_init_fb_row);
          }
          else {
            uVar39 = 0;
            uVar33 = 0;
            if ((((1 < (cpi->mt_info).num_mod_workers[7]) &&
                 (pSVar12 = (cpi->common).seq_params, pSVar12->enable_cdef != '\0')) &&
                (((cpi->common).features.coded_lossless == false &&
                 ((uVar39 = uVar33, (cpi->common).tiles.large_scale == 0 &&
                  ((cpi->ppi->rtc_ref).non_reference_frame == 0)))))) &&
               ((pSVar12->enable_restoration == '\0' ||
                ((cpi->common).features.all_lossless == true)))) {
              uVar39 = (uint)((cpi->common).width == (cpi->common).superres_upscaled_width);
            }
            av1_cdef_frame_mt(local_168,xd,(cpi->mt_info).cdef_worker,(cpi->mt_info).workers,
                              &(cpi->mt_info).cdef_sync,iVar18,av1_cdef_init_fb_row_mt,uVar39);
          }
        }
      }
      if (((bVar40 & 2) == 0) && ((cpi->common).width != (cpi->common).superres_upscaled_width)) {
        av1_superres_post_encode(cpi);
      }
      if (!bVar52) {
        iVar18 = (cpi->mt_info).num_mod_workers[8];
        av1_loop_restoration_save_boundary_lines(&((cpi->common).cur_frame)->buf,local_168,1);
        av1_pick_filter_restoration(cpi->source,cpi);
        if (((bVar40 & 1) == 0) &&
           ((((cpi->common).rst_info[0].frame_restoration_type != RESTORE_NONE ||
             ((cpi->common).rst_info[1].frame_restoration_type != RESTORE_NONE)) ||
            ((cpi->common).rst_info[2].frame_restoration_type != RESTORE_NONE)))) {
          pYVar27 = &((cpi->common).cur_frame)->buf;
          if (iVar18 < 2) {
            av1_loop_restoration_filter_frame(pYVar27,local_168,0,&cpi->lr_ctxt);
          }
          else {
            av1_loop_restoration_filter_frame_mt
                      (pYVar27,local_168,0,(cpi->mt_info).workers,iVar18,&(cpi->mt_info).lr_row_sync
                       ,&cpi->lr_ctxt,1);
          }
        }
      }
    }
    if (((cpi->oxcf).mode != '\x02') && ((cpi->ppi->rtc_ref).non_reference_frame == 0)) {
      pRVar49 = (cpi->common).rst_info;
      uVar28 = 0;
      do {
        if ((((((cpi->mt_info).num_mod_workers[7] < 2) ||
              (pSVar12 = (cpi->common).seq_params, pSVar12->enable_cdef == '\0')) ||
             (((cpi->common).features.coded_lossless != false ||
              (((cpi->common).tiles.large_scale != 0 ||
               ((cpi->ppi->rtc_ref).non_reference_frame != 0)))))) ||
            (((pSVar12->enable_restoration != '\0' && ((cpi->common).features.all_lossless != true))
             || ((cpi->common).width != (cpi->common).superres_upscaled_width)))) &&
           (((((cpi->mt_info).num_mod_workers[8] < 2 ||
              (((cpi->common).seq_params)->enable_restoration == '\0')) ||
             ((cpi->common).features.all_lossless != false)) ||
            (((cpi->common).tiles.large_scale != 0 ||
             (pRVar49->frame_restoration_type == RESTORE_NONE)))))) {
          pRVar30 = (cpi->common).cur_frame;
          aom_extend_frame_borders_plane_row_c
                    (&pRVar30->buf,(int)uVar28,0,
                     *(int *)((long)(pRVar30->buf).store_buf_adr + (ulong)(uVar28 != 0) * 4 + -0x30)
                    );
        }
        if (((cpi->common).seq_params)->monochrome != '\0') break;
        pRVar49 = pRVar49 + 1;
        bVar50 = uVar28 < 2;
        uVar28 = uVar28 + 1;
      } while (bVar50);
    }
    if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_FILM) {
      (cpi->common).film_grain_params.apply_grain = 1;
      (cpi->common).film_grain_params.update_parameters = 1;
      iVar18 = rand();
      (cpi->common).film_grain_params.random_seed = (uint16_t)iVar18;
      (cpi->common).film_grain_params.num_y_points = 1;
      (cpi->common).film_grain_params.scaling_points_y[0] = (int  [2])0x6400000080;
      if (((cpi->common).seq_params)->monochrome == '\0') {
        (cpi->common).film_grain_params.num_cb_points = 1;
        *(int *)((long)((cpi->common).film_grain_params.scaling_points_cr + 0) + 0) = 0x80;
        (cpi->common).film_grain_params.scaling_points_cb[0] = (int  [2])0x6400000080;
        (cpi->common).film_grain_params.num_cr_points = 1;
        uVar41 = 100;
        lVar23 = 0x41d1c;
      }
      else {
        (cpi->common).film_grain_params.num_cb_points = 0;
        uVar41 = 0;
        lVar23 = 0x41d68;
      }
      *(undefined4 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar23) = uVar41
      ;
      (cpi->common).film_grain_params.chroma_scaling_from_luma = 0;
      (cpi->common).film_grain_params.grain_scale_shift = 0;
      (cpi->common).film_grain_params.scaling_shift = 1;
      (cpi->common).film_grain_params.ar_coeff_lag = 0;
      (cpi->common).film_grain_params.ar_coeff_shift = 1;
      (cpi->common).film_grain_params.overlap_flag = 1;
    }
    av1_finalize_encoded_frame(cpi);
    (cpi->rc).coefficient_size = 0;
    iVar18 = av1_pack_bitstream(cpi,local_f8,local_f0,local_158,largest_tile_id);
    uVar39 = 1;
    if (iVar18 == 0) {
      if ((((cpi->rc).postencode_drop != 0) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
         ((((cpi->ppi->lap_enabled == 0 &&
            ((((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)) &&
             ((cpi->oxcf).rc_cfg.mode == AOM_CBR)))) &&
           (((0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark &&
             ((cpi->rc).rtc_external_ratectrl == 0)) &&
            (((local_168->current_frame).frame_type & 0xfd) != 0)))) &&
          (((cpi->svc).spatial_layer_id == 0 &&
           (iVar18 = av1_postencode_drop_cbr(cpi,local_158), iVar18 != 0)))))) {
        return 0;
      }
      piVar15 = local_108;
      if (local_108 != (int64_t *)0x0) {
        pYVar27 = &((cpi->common).cur_frame)->buf;
        if (pSVar46->use_highbitdepth == '\0') {
          iVar32 = aom_get_y_sse(cpi->source,pYVar27);
        }
        else {
          iVar32 = aom_highbd_get_y_sse(cpi->source,pYVar27);
        }
        *piVar15 = iVar32;
      }
      psVar14 = local_158;
      if (local_100 != (long *)0x0) {
        *local_100 = *local_158 << 8;
      }
      uVar39 = 0;
      if (cpi->use_ducky_encode != 0) {
        aom_calc_psnr(cpi->source,&((cpi->common).cur_frame)->buf,
                      (PSNR_STATS *)&frame_over_shoot_limit);
        (cpi->ducky_encode_info).frame_result.global_order_idx =
             ((cpi->common).cur_frame)->display_order_hint;
        (cpi->ducky_encode_info).frame_result.q_index = (cpi->common).quant_params.base_qindex;
        (cpi->ducky_encode_info).frame_result.rdmult = (cpi->rd).RDMULT;
        (cpi->ducky_encode_info).frame_result.rate = (int)*psVar14 << 3;
        (cpi->ducky_encode_info).frame_result.dist = local_b0;
        (cpi->ducky_encode_info).frame_result.psnr =
             (double)CONCAT44(uStack_cc,frame_over_shoot_limit);
        uVar39 = 0;
      }
    }
  }
  else if (uVar39 == 0xffffffff) {
    if (local_108 != (int64_t *)0x0) {
      *local_108 = 0x7fffffffffffffff;
    }
    if (local_100 != (long *)0x0) {
      *local_100 = 0x7fffffffffffffff;
    }
    *largest_tile_id = 0;
    uVar39 = 0;
  }
  return uVar39;
}

Assistant:

static int encode_with_recode_loop_and_filter(AV1_COMP *cpi, size_t *size,
                                              uint8_t *dest, size_t dest_size,
                                              int64_t *sse, int64_t *rate,
                                              int *largest_tile_id) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_with_or_without_recode_time);
#endif
  for (int i = 0; i < NUM_RECODES_PER_FRAME; i++) {
    cpi->do_update_frame_probs_txtype[i] = 0;
    cpi->do_update_frame_probs_obmc[i] = 0;
    cpi->do_update_frame_probs_warp[i] = 0;
    cpi->do_update_frame_probs_interpfilter[i] = 0;
  }

  cpi->do_update_vbr_bits_off_target_fast = 0;
  int err;
#if CONFIG_REALTIME_ONLY
  err = encode_without_recode(cpi);
#else
  if (cpi->sf.hl_sf.recode_loop == DISALLOW_RECODE)
    err = encode_without_recode(cpi);
  else
    err = encode_with_recode_loop(cpi, size, dest, dest_size);
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_with_or_without_recode_time);
#endif
  if (err != AOM_CODEC_OK) {
    if (err == -1) {
      // special case as described in encode_with_recode_loop().
      // Encoding was skipped.
      err = AOM_CODEC_OK;
      if (sse != NULL) *sse = INT64_MAX;
      if (rate != NULL) *rate = INT64_MAX;
      *largest_tile_id = 0;
    }
    return err;
  }

#ifdef OUTPUT_YUV_DENOISED
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  if (oxcf->noise_sensitivity > 0 && denoise_svc(cpi)) {
    aom_write_yuv_frame(yuv_denoised_file,
                        &cpi->denoiser.running_avg_y[INTRA_FRAME]);
  }
#endif

  AV1_COMMON *const cm = &cpi->common;
  SequenceHeader *const seq_params = cm->seq_params;

  // Special case code to reduce pulsing when key frames are forced at a
  // fixed interval. Note the reconstruction error if it is the frame before
  // the force key frame
  if (cpi->ppi->p_rc.next_key_frame_forced && cpi->rc.frames_to_key == 1) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (seq_params->use_highbitdepth) {
      cpi->ambient_err = aom_highbd_get_y_sse(cpi->source, &cm->cur_frame->buf);
    } else {
      cpi->ambient_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
    }
#else
    cpi->ambient_err = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#endif
  }

  cm->cur_frame->buf.color_primaries = seq_params->color_primaries;
  cm->cur_frame->buf.transfer_characteristics =
      seq_params->transfer_characteristics;
  cm->cur_frame->buf.matrix_coefficients = seq_params->matrix_coefficients;
  cm->cur_frame->buf.monochrome = seq_params->monochrome;
  cm->cur_frame->buf.chroma_sample_position =
      seq_params->chroma_sample_position;
  cm->cur_frame->buf.color_range = seq_params->color_range;
  cm->cur_frame->buf.render_width = cm->render_width;
  cm->cur_frame->buf.render_height = cm->render_height;

  if (!cpi->mt_info.pipeline_lpf_mt_with_enc)
    set_postproc_filter_default_params(&cpi->common);

  if (!cm->features.allow_intrabc) {
    loopfilter_frame(cpi, cm);
  }

  if (cpi->oxcf.mode != ALLINTRA && !cpi->ppi->rtc_ref.non_reference_frame) {
    extend_frame_borders(cpi);
  }

#ifdef OUTPUT_YUV_REC
  aom_write_one_yuv_frame(cm, &cm->cur_frame->buf);
#endif

  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_FILM) {
    set_grain_syn_params(cm);
  }

  av1_finalize_encoded_frame(cpi);
  // Build the bitstream
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_pack_bitstream_final_time);
#endif
  cpi->rc.coefficient_size = 0;
  if (av1_pack_bitstream(cpi, dest, dest_size, size, largest_tile_id) !=
      AOM_CODEC_OK)
    return AOM_CODEC_ERROR;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_pack_bitstream_final_time);
#endif

  if (cpi->rc.postencode_drop && allow_postencode_drop_rtc(cpi) &&
      av1_postencode_drop_cbr(cpi, size)) {
    return AOM_CODEC_OK;
  }

  // Compute sse and rate.
  if (sse != NULL) {
#if CONFIG_AV1_HIGHBITDEPTH
    *sse = (seq_params->use_highbitdepth)
               ? aom_highbd_get_y_sse(cpi->source, &cm->cur_frame->buf)
               : aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#else
    *sse = aom_get_y_sse(cpi->source, &cm->cur_frame->buf);
#endif
  }
  if (rate != NULL) {
    const int64_t bits = (*size << 3);
    *rate = (bits << 5);  // To match scale.
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->use_ducky_encode) {
    PSNR_STATS psnr;
    aom_calc_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr);
    DuckyEncodeFrameResult *frame_result = &cpi->ducky_encode_info.frame_result;
    frame_result->global_order_idx = cm->cur_frame->display_order_hint;
    frame_result->q_index = cm->quant_params.base_qindex;
    frame_result->rdmult = cpi->rd.RDMULT;
    frame_result->rate = (int)(*size) * 8;
    frame_result->dist = psnr.sse[0];
    frame_result->psnr = psnr.psnr[0];
  }
#endif  // !CONFIG_REALTIME_ONLY

  return AOM_CODEC_OK;
}